

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

ssize_t correct_convolutional_sse_decode_soft
                  (correct_convolutional_sse *conv,soft_t *encoded,size_t num_encoded_bits,
                  uint8_t *msg)

{
  ulong in_RDX;
  soft_t *in_RDI;
  size_t unaff_retaddr;
  size_t num_encoded_bytes;
  uint8_t *in_stack_fffffffffffffff8;
  ssize_t sVar1;
  
  if (in_RDX % *(ulong *)(in_RDI + 8) == 0) {
    sVar1 = _convolutional_sse_decode
                      ((correct_convolutional_sse *)msg,num_encoded_bytes,unaff_retaddr,
                       in_stack_fffffffffffffff8,in_RDI);
  }
  else {
    sVar1 = -1;
  }
  return sVar1;
}

Assistant:

ssize_t correct_convolutional_sse_decode_soft(correct_convolutional_sse *conv, const soft_t *encoded,
                                              size_t num_encoded_bits, uint8_t *msg) {
    if (num_encoded_bits % conv->base_conv.rate) {
        // XXX turn this into an error code
        // printf("encoded length of message must be a multiple of rate\n");
        return -1;
    }

    size_t num_encoded_bytes =
        (num_encoded_bits % 8) ? (num_encoded_bits / 8 + 1) : (num_encoded_bits / 8);

    return _convolutional_sse_decode(conv, num_encoded_bits, num_encoded_bytes, msg, encoded);
}